

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_appender<char>
fmt::v11::detail::write_float<char,fmt::v11::basic_appender<char>,float>
          (basic_appender<char> out,float value,format_specs specs,locale_ref loc)

{
  int iVar1;
  basic_appender<char> bVar2;
  size_t sVar3;
  buffer<char> *buf;
  basic_specs bVar4;
  sign s;
  basic_specs this;
  ulong uVar5;
  sign in_R9D;
  char precision [4];
  uint uVar6;
  bool bVar7;
  format_specs specs_00;
  format_specs specs_01;
  big_decimal_fp f;
  memory_buffer buffer;
  undefined1 local_278 [12];
  char acStack_26c [4];
  float local_264;
  locale_ref local_260;
  big_decimal_fp local_258;
  buffer<char> local_248;
  char local_228 [504];
  
  bVar4 = specs._8_8_;
  this = specs.super_basic_specs;
  uVar6 = specs.super_basic_specs.data_;
  s = minus;
  if (-1 < (int)value) {
    s = (sign)((ulong)this >> 10) & space;
  }
  local_278._0_8_ = this;
  unique0x10000295 = bVar4;
  if (0x7f7fffff < (uint)ABS(value)) {
    bVar2.container._1_7_ = 0;
    bVar2.container._0_1_ = NAN(value);
    specs_01.width = s;
    specs_01.super_basic_specs = bVar4;
    specs_01.precision = 0;
    bVar2 = write_nonfinite<char,fmt::v11::basic_appender<char>>
                      (out.container,bVar2,specs.super_basic_specs.data_._0_1_,specs_01,in_R9D);
    return (basic_appender<char>)bVar2.container;
  }
  bVar7 = (uVar6 & 0x38) != 0x20;
  buf = (buffer<char> *)CONCAT71((int7)((ulong)loc.locale_ >> 8),s == none || bVar7);
  local_260.locale_ = loc.locale_;
  if (s != none && !bVar7) {
    sVar3 = (out.container)->size_;
    uVar5 = sVar3 + 1;
    if ((out.container)->capacity_ < uVar5) {
      local_264 = value;
      (*(out.container)->grow_)(out.container,uVar5);
      sVar3 = (out.container)->size_;
      uVar5 = sVar3 + 1;
      value = local_264;
    }
    buf = (buffer<char> *)(out.container)->ptr_;
    (out.container)->size_ = uVar5;
    *(char *)((long)&buf->ptr_ + sVar3) = (char)(0x202b2d00 >> (sbyte)(s << 3));
    s = none;
    if (specs.width != 0) {
      local_278._8_4_ = specs.width - 1;
    }
  }
  precision = (char  [4])specs.precision;
  if (((long)bVar4 < 0) &&
     (precision[0] = '\x06', precision[1] = '\0', precision[2] = '\0', precision[3] = '\0',
     ((undefined1  [16])specs & (undefined1  [16])0x7) == (undefined1  [16])0x0)) {
    local_248.ptr_ = (char *)dragonbox::to_decimal<float>(value);
    bVar2 = do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>
                      (out,&local_248,(format_specs *)local_278,s,7,local_260);
    return (basic_appender<char>)bVar2.container;
  }
  local_248.size_ = 0;
  local_248.grow_ = basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  local_248.capacity_ = 500;
  local_248.ptr_ = local_228;
  if ((specs.super_basic_specs.data_._0_1_ & 7U) == 1) {
    if (precision == (char  [4])0x7fffffff) {
      report_error("number is too big");
    }
    precision = (char  [4])((int)precision + 1);
LAB_001447ae:
    if ((ulong)bVar4 >> 0x20 != 0) {
      local_278._0_8_ = CONCAT44(local_278._4_4_,uVar6) | 0x2000;
    }
  }
  else {
    if ((uVar6 & 7) == 2) goto LAB_001447ae;
    if ((uVar6 & 7) == 4) {
      if (s != none) {
        buf = (buffer<char> *)(ulong)(s << 3);
        local_228[0] = (char)(0x202b2d00 >> (sbyte)(s << 3));
      }
      local_248.size_ = (size_t)(s != none);
      specs_00._8_8_ = &local_248;
      specs_00.super_basic_specs = stack0xfffffffffffffd90;
      format_hexfloat<double,_0>((detail *)this,(double)value,specs_00,buf);
      local_258.significand = local_248.ptr_;
      local_258.significand_size = (undefined4)local_248.size_;
      local_258.exponent = local_248.size_._4_4_;
      bVar2 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_bytes<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>>(fmt::v11::basic_appender<char>,fmt::v11::basic_string_view<char>,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                        (out,(format_specs *)local_278,local_248.size_,local_248.size_,
                         (anon_class_16_1_a7b7af8b *)&local_258);
      goto LAB_00144810;
    }
    precision = (char  [4])((int)precision + (uint)(precision == (char  [4])0x0));
  }
  iVar1 = format_float<double>
                    ((double)value,(int)precision,(format_specs *)local_278,true,&local_248);
  acStack_26c[0] = precision[0];
  acStack_26c[1] = precision[1];
  acStack_26c[2] = precision[2];
  acStack_26c[3] = precision[3];
  local_258.significand = local_248.ptr_;
  local_258._8_8_ = CONCAT44(iVar1,(int)local_248.size_);
  bVar2 = do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>
                    (out,&local_258,(format_specs *)local_278,s,7,local_260);
LAB_00144810:
  if (local_248.ptr_ != local_228) {
    free(local_248.ptr_);
  }
  return (basic_appender<char>)bVar2.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_float(OutputIt out, T value, format_specs specs,
                                 locale_ref loc) -> OutputIt {
  // Use signbit because value < 0 is false for NaN.
  sign s = detail::signbit(value) ? sign::minus : specs.sign();

  if (!detail::isfinite(value))
    return write_nonfinite<Char>(out, detail::isnan(value), specs, s);

  if (specs.align() == align::numeric && s != sign::none) {
    *out++ = detail::getsign<Char>(s);
    s = sign::none;
    if (specs.width != 0) --specs.width;
  }

  constexpr int exp_upper = detail::exp_upper<T>();
  int precision = specs.precision;
  if (precision < 0) {
    if (specs.type() != presentation_type::none) {
      precision = 6;
    } else if (is_fast_float<T>::value && !is_constant_evaluated()) {
      // Use Dragonbox for the shortest format.
      using floaty = conditional_t<sizeof(T) >= sizeof(double), double, float>;
      auto dec = dragonbox::to_decimal(static_cast<floaty>(value));
      return write_float<Char>(out, dec, specs, s, exp_upper, loc);
    }
  }

  memory_buffer buffer;
  if (specs.type() == presentation_type::hexfloat) {
    if (s != sign::none) buffer.push_back(detail::getsign<char>(s));
    format_hexfloat(convert_float(value), specs, buffer);
    return write_bytes<Char, align::right>(out, {buffer.data(), buffer.size()},
                                           specs);
  }

  if (specs.type() == presentation_type::exp) {
    if (precision == max_value<int>())
      report_error("number is too big");
    else
      ++precision;
    if (specs.precision != 0) specs.set_alt();
  } else if (specs.type() == presentation_type::fixed) {
    if (specs.precision != 0) specs.set_alt();
  } else if (precision == 0) {
    precision = 1;
  }
  int exp = format_float(convert_float(value), precision, specs,
                         std::is_same<T, float>(), buffer);

  specs.precision = precision;
  auto f = big_decimal_fp{buffer.data(), static_cast<int>(buffer.size()), exp};
  return write_float<Char>(out, f, specs, s, exp_upper, loc);
}